

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O3

void __thiscall
rr::FragmentProcessor::executeBlendFactorComputeRGB
          (FragmentProcessor *this,Vec4 *blendColor,BlendState *blendRGBState)

{
  undefined4 uVar1;
  int regSampleNdx;
  long lVar2;
  int i;
  long lVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  Vector<float,_3> res;
  undefined8 local_20;
  float local_18;
  float local_10 [4];
  
  switch(blendRGBState->srcFunc) {
  case BLENDFUNC_ZERO:
    lVar2 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) ==
          '\x01') {
        *(undefined4 *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar2 + 8) = 0;
        *(undefined8 *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar2) = 0;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x2100);
    break;
  case BLENDFUNC_ONE:
    lVar2 = 0x3c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -4) + lVar2) == '\x01')
      {
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc)
             = 0x3f8000003f800000;
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) =
             0x3f800000;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x213c);
    break;
  case BLENDFUNC_SRC_COLOR:
    lVar2 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) ==
          '\x01') {
        uVar1 = *(undefined4 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + 8);
        *(undefined8 *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar2) =
             *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2);
        *(undefined4 *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar2 + 8) =
             uVar1;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x2100);
    break;
  case BLENDFUNC_ONE_MINUS_SRC_COLOR:
    lVar2 = 0;
    do {
      if (this->m_sampleRegister[lVar2].isAlive == true) {
        local_10[0] = 1.0;
        local_10[1] = 1.0;
        local_10[2] = 1.0;
        local_20 = *(undefined8 *)this->m_sampleRegister[lVar2].clampedBlendSrcColor.m_data;
        local_18 = this->m_sampleRegister[lVar2].clampedBlendSrcColor.m_data[2];
        res.m_data[0] = 0.0;
        res.m_data[1] = 0.0;
        res.m_data[2] = 0.0;
        lVar3 = 0;
        do {
          res.m_data[lVar3] = local_10[lVar3] - *(float *)((long)&local_20 + lVar3 * 4);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        this->m_sampleRegister[lVar2].blendSrcFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar2].blendSrcFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x40);
    break;
  case BLENDFUNC_DST_COLOR:
    lVar2 = 0x3c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -4) + lVar2) == '\x01')
      {
        uVar1 = *(undefined4 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0x14);
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc)
             = *(undefined8 *)
                ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0x1c);
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) =
             uVar1;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x213c);
    break;
  case BLENDFUNC_ONE_MINUS_DST_COLOR:
    lVar2 = 0;
    do {
      if (this->m_sampleRegister[lVar2].isAlive == true) {
        local_10[0] = 1.0;
        local_10[1] = 1.0;
        local_10[2] = 1.0;
        local_20 = *(undefined8 *)this->m_sampleRegister[lVar2].clampedBlendDstColor.m_data;
        local_18 = this->m_sampleRegister[lVar2].clampedBlendDstColor.m_data[2];
        res.m_data[0] = 0.0;
        res.m_data[1] = 0.0;
        res.m_data[2] = 0.0;
        lVar3 = 0;
        do {
          res.m_data[lVar3] = local_10[lVar3] - *(float *)((long)&local_20 + lVar3 * 4);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        this->m_sampleRegister[lVar2].blendSrcFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar2].blendSrcFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x40);
    break;
  case BLENDFUNC_SRC_ALPHA:
    lVar2 = 0x3c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -4) + lVar2) == '\x01')
      {
        uVar1 = *(undefined4 *)
                 ((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -3) + lVar2);
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc)
             = uVar1;
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -8) =
             uVar1;
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) =
             uVar1;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x213c);
    break;
  case BLENDFUNC_ONE_MINUS_SRC_ALPHA:
    lVar2 = 0x3c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -4) + lVar2) == '\x01')
      {
        fVar5 = 1.0 - *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -3) +
                                lVar2);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc) =
             fVar5;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -8) = fVar5
        ;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) = fVar5
        ;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x213c);
    break;
  case BLENDFUNC_DST_ALPHA:
    lVar2 = 0x3c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -4) + lVar2) == '\x01')
      {
        uVar1 = *(undefined4 *)
                 ((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -1) + lVar2);
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc)
             = uVar1;
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -8) =
             uVar1;
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) =
             uVar1;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x213c);
    break;
  case BLENDFUNC_ONE_MINUS_DST_ALPHA:
    lVar2 = 0x3c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -4) + lVar2) == '\x01')
      {
        fVar5 = 1.0 - *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -1) +
                                lVar2);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc) =
             fVar5;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -8) = fVar5
        ;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) = fVar5
        ;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x213c);
    break;
  case BLENDFUNC_CONSTANT_COLOR:
    lVar2 = 0x3c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -4) + lVar2) == '\x01')
      {
        fVar5 = blendColor->m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc)
             = *(undefined8 *)blendColor->m_data;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) = fVar5
        ;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x213c);
    break;
  case BLENDFUNC_ONE_MINUS_CONSTANT_COLOR:
    lVar2 = 0;
    do {
      if (this->m_sampleRegister[lVar2].isAlive == true) {
        local_10[0] = 1.0;
        local_10[1] = 1.0;
        local_10[2] = 1.0;
        local_20 = *(undefined8 *)blendColor->m_data;
        local_18 = blendColor->m_data[2];
        res.m_data[0] = 0.0;
        res.m_data[1] = 0.0;
        res.m_data[2] = 0.0;
        lVar3 = 0;
        do {
          res.m_data[lVar3] = local_10[lVar3] - *(float *)((long)&local_20 + lVar3 * 4);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        this->m_sampleRegister[lVar2].blendSrcFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar2].blendSrcFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x40);
    break;
  case BLENDFUNC_CONSTANT_ALPHA:
    lVar2 = 0x3c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -4) + lVar2) == '\x01')
      {
        fVar5 = blendColor->m_data[3];
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc) =
             fVar5;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -8) = fVar5
        ;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) = fVar5
        ;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x213c);
    break;
  case BLENDFUNC_ONE_MINUS_CONSTANT_ALPHA:
    lVar2 = 0x3c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -4) + lVar2) == '\x01')
      {
        fVar5 = 1.0 - blendColor->m_data[3];
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc) =
             fVar5;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -8) = fVar5
        ;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) = fVar5
        ;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x213c);
    break;
  case BLENDFUNC_SRC_ALPHA_SATURATE:
    lVar2 = 0x3c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -4) + lVar2) == '\x01')
      {
        fVar5 = *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -3) + lVar2);
        fVar6 = 1.0 - *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -1) +
                                lVar2);
        uVar4 = -(uint)(fVar5 <= fVar6);
        uVar4 = uVar4 & (uint)fVar5 | ~uVar4 & (uint)fVar6;
        *(uint *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc) =
             uVar4;
        *(uint *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -8) = uVar4;
        *(uint *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) = uVar4;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x213c);
    break;
  case BLENDFUNC_SRC1_COLOR:
    lVar2 = 0x3c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -4) + lVar2) == '\x01')
      {
        uVar1 = *(undefined4 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0x24);
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc)
             = *(undefined8 *)
                ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0x2c);
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) =
             uVar1;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x213c);
    break;
  case BLENDFUNC_ONE_MINUS_SRC1_COLOR:
    lVar2 = 0;
    do {
      if (this->m_sampleRegister[lVar2].isAlive == true) {
        local_10[0] = 1.0;
        local_10[1] = 1.0;
        local_10[2] = 1.0;
        local_20 = *(undefined8 *)this->m_sampleRegister[lVar2].clampedBlendSrc1Color.m_data;
        local_18 = this->m_sampleRegister[lVar2].clampedBlendSrc1Color.m_data[2];
        res.m_data[0] = 0.0;
        res.m_data[1] = 0.0;
        res.m_data[2] = 0.0;
        lVar3 = 0;
        do {
          res.m_data[lVar3] = local_10[lVar3] - *(float *)((long)&local_20 + lVar3 * 4);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        this->m_sampleRegister[lVar2].blendSrcFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar2].blendSrcFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x40);
    break;
  case BLENDFUNC_SRC1_ALPHA:
    lVar2 = 0x3c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -4) + lVar2) == '\x01')
      {
        uVar1 = *(undefined4 *)
                 ((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) + lVar2);
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc)
             = uVar1;
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -8) =
             uVar1;
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) =
             uVar1;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x213c);
    break;
  case BLENDFUNC_ONE_MINUS_SRC1_ALPHA:
    lVar2 = 0x3c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -4) + lVar2) == '\x01')
      {
        fVar5 = 1.0 - *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) +
                                lVar2);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc) =
             fVar5;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -8) = fVar5
        ;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) = fVar5
        ;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x213c);
  }
  switch(blendRGBState->dstFunc) {
  case BLENDFUNC_ZERO:
    lVar2 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) ==
          '\x01') {
        *(undefined4 *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar2 + 8) = 0;
        *(undefined8 *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar2) = 0;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x2100);
    break;
  case BLENDFUNC_ONE:
    lVar2 = 0x4c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -5) + lVar2) == '\x01')
      {
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc)
             = 0x3f8000003f800000;
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) =
             0x3f800000;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x214c);
    break;
  case BLENDFUNC_SRC_COLOR:
    lVar2 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) ==
          '\x01') {
        uVar1 = *(undefined4 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + 8);
        *(undefined8 *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar2) =
             *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2);
        *(undefined4 *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar2 + 8) =
             uVar1;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x2100);
    break;
  case BLENDFUNC_ONE_MINUS_SRC_COLOR:
    lVar2 = 0;
    do {
      if (this->m_sampleRegister[lVar2].isAlive == true) {
        local_10[0] = 1.0;
        local_10[1] = 1.0;
        local_10[2] = 1.0;
        local_20 = *(undefined8 *)this->m_sampleRegister[lVar2].clampedBlendSrcColor.m_data;
        local_18 = this->m_sampleRegister[lVar2].clampedBlendSrcColor.m_data[2];
        res.m_data[0] = 0.0;
        res.m_data[1] = 0.0;
        res.m_data[2] = 0.0;
        lVar3 = 0;
        do {
          res.m_data[lVar3] = local_10[lVar3] - *(float *)((long)&local_20 + lVar3 * 4);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        this->m_sampleRegister[lVar2].blendDstFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar2].blendDstFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x40);
    break;
  case BLENDFUNC_DST_COLOR:
    lVar2 = 0x4c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -5) + lVar2) == '\x01')
      {
        uVar1 = *(undefined4 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0x24);
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc)
             = *(undefined8 *)
                ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0x2c);
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) =
             uVar1;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x214c);
    break;
  case BLENDFUNC_ONE_MINUS_DST_COLOR:
    lVar2 = 0;
    do {
      if (this->m_sampleRegister[lVar2].isAlive == true) {
        local_10[0] = 1.0;
        local_10[1] = 1.0;
        local_10[2] = 1.0;
        local_20 = *(undefined8 *)this->m_sampleRegister[lVar2].clampedBlendDstColor.m_data;
        local_18 = this->m_sampleRegister[lVar2].clampedBlendDstColor.m_data[2];
        res.m_data[0] = 0.0;
        res.m_data[1] = 0.0;
        res.m_data[2] = 0.0;
        lVar3 = 0;
        do {
          res.m_data[lVar3] = local_10[lVar3] - *(float *)((long)&local_20 + lVar3 * 4);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        this->m_sampleRegister[lVar2].blendDstFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar2].blendDstFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x40);
    break;
  case BLENDFUNC_SRC_ALPHA:
    lVar2 = 0x4c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -5) + lVar2) == '\x01')
      {
        uVar1 = *(undefined4 *)
                 ((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -4) + lVar2);
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc)
             = uVar1;
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -8) =
             uVar1;
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) =
             uVar1;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x214c);
    break;
  case BLENDFUNC_ONE_MINUS_SRC_ALPHA:
    lVar2 = 0x4c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -5) + lVar2) == '\x01')
      {
        fVar5 = 1.0 - *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -4) +
                                lVar2);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc) =
             fVar5;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -8) = fVar5
        ;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) = fVar5
        ;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x214c);
    break;
  case BLENDFUNC_DST_ALPHA:
    lVar2 = 0x4c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -5) + lVar2) == '\x01')
      {
        uVar1 = *(undefined4 *)
                 ((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) + lVar2);
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc)
             = uVar1;
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -8) =
             uVar1;
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) =
             uVar1;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x214c);
    break;
  case BLENDFUNC_ONE_MINUS_DST_ALPHA:
    lVar2 = 0x4c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -5) + lVar2) == '\x01')
      {
        fVar5 = 1.0 - *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) +
                                lVar2);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc) =
             fVar5;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -8) = fVar5
        ;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) = fVar5
        ;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x214c);
    break;
  case BLENDFUNC_CONSTANT_COLOR:
    lVar2 = 0x4c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -5) + lVar2) == '\x01')
      {
        fVar5 = blendColor->m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc)
             = *(undefined8 *)blendColor->m_data;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) = fVar5
        ;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x214c);
    break;
  case BLENDFUNC_ONE_MINUS_CONSTANT_COLOR:
    lVar2 = 0;
    do {
      if (this->m_sampleRegister[lVar2].isAlive == true) {
        local_10[0] = 1.0;
        local_10[1] = 1.0;
        local_10[2] = 1.0;
        local_20 = *(undefined8 *)blendColor->m_data;
        local_18 = blendColor->m_data[2];
        res.m_data[0] = 0.0;
        res.m_data[1] = 0.0;
        res.m_data[2] = 0.0;
        lVar3 = 0;
        do {
          res.m_data[lVar3] = local_10[lVar3] - *(float *)((long)&local_20 + lVar3 * 4);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        this->m_sampleRegister[lVar2].blendDstFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar2].blendDstFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x40);
    break;
  case BLENDFUNC_CONSTANT_ALPHA:
    lVar2 = 0x4c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -5) + lVar2) == '\x01')
      {
        fVar5 = blendColor->m_data[3];
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc) =
             fVar5;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -8) = fVar5
        ;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) = fVar5
        ;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x214c);
    break;
  case BLENDFUNC_ONE_MINUS_CONSTANT_ALPHA:
    lVar2 = 0x4c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -5) + lVar2) == '\x01')
      {
        fVar5 = 1.0 - blendColor->m_data[3];
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc) =
             fVar5;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -8) = fVar5
        ;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) = fVar5
        ;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x214c);
    break;
  case BLENDFUNC_SRC_ALPHA_SATURATE:
    lVar2 = 0x4c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -5) + lVar2) == '\x01')
      {
        fVar5 = *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -4) + lVar2);
        fVar6 = 1.0 - *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) +
                                lVar2);
        uVar4 = -(uint)(fVar5 <= fVar6);
        uVar4 = uVar4 & (uint)fVar5 | ~uVar4 & (uint)fVar6;
        *(uint *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc) =
             uVar4;
        *(uint *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -8) = uVar4;
        *(uint *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) = uVar4;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x214c);
    break;
  case BLENDFUNC_SRC1_COLOR:
    lVar2 = 0x4c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -5) + lVar2) == '\x01')
      {
        uVar1 = *(undefined4 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0x34);
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc)
             = *(undefined8 *)
                ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0x3c);
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) =
             uVar1;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x214c);
    break;
  case BLENDFUNC_ONE_MINUS_SRC1_COLOR:
    lVar2 = 0;
    do {
      if (this->m_sampleRegister[lVar2].isAlive == true) {
        local_10[0] = 1.0;
        local_10[1] = 1.0;
        local_10[2] = 1.0;
        local_20 = *(undefined8 *)this->m_sampleRegister[lVar2].clampedBlendSrc1Color.m_data;
        local_18 = this->m_sampleRegister[lVar2].clampedBlendSrc1Color.m_data[2];
        res.m_data[0] = 0.0;
        res.m_data[1] = 0.0;
        res.m_data[2] = 0.0;
        lVar3 = 0;
        do {
          res.m_data[lVar3] = local_10[lVar3] - *(float *)((long)&local_20 + lVar3 * 4);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        this->m_sampleRegister[lVar2].blendDstFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar2].blendDstFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x40);
    break;
  case BLENDFUNC_SRC1_ALPHA:
    lVar2 = 0x4c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -5) + lVar2) == '\x01')
      {
        uVar1 = *(undefined4 *)
                 ((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -3) + lVar2);
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc)
             = uVar1;
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -8) =
             uVar1;
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) =
             uVar1;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x214c);
    break;
  case BLENDFUNC_ONE_MINUS_SRC1_ALPHA:
    lVar2 = 0x4c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -5) + lVar2) == '\x01')
      {
        fVar5 = 1.0 - *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -3) +
                                lVar2);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc) =
             fVar5;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -8) = fVar5
        ;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) = fVar5
        ;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x214c);
  }
  return;
}

Assistant:

void FragmentProcessor::executeBlendFactorComputeRGB (const Vec4& blendColor, const BlendState& blendRGBState)
{
#define SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, FACTOR_EXPRESSION)																				\
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)																	\
	{																																				\
		if (m_sampleRegister[regSampleNdx].isAlive)																									\
		{																																			\
			const Vec4& src		= m_sampleRegister[regSampleNdx].clampedBlendSrcColor;																\
			const Vec4& src1	= m_sampleRegister[regSampleNdx].clampedBlendSrc1Color;																\
			const Vec4& dst		= m_sampleRegister[regSampleNdx].clampedBlendDstColor;																\
			DE_UNREF(src);																															\
			DE_UNREF(src1);																															\
			DE_UNREF(dst);																															\
																																					\
			m_sampleRegister[regSampleNdx].FACTOR_NAME = (FACTOR_EXPRESSION);																		\
		}																																			\
	}

#define SWITCH_SRC_OR_DST_FACTOR_RGB(FUNC_NAME, FACTOR_NAME)																					\
	switch (blendRGBState.FUNC_NAME)																											\
	{																																			\
		case BLENDFUNC_ZERO:						SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(0.0f))								break;	\
		case BLENDFUNC_ONE:							SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f))								break;	\
		case BLENDFUNC_SRC_COLOR:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, src.swizzle(0,1,2))						break;	\
		case BLENDFUNC_ONE_MINUS_SRC_COLOR:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f) - src.swizzle(0,1,2))			break;	\
		case BLENDFUNC_DST_COLOR:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, dst.swizzle(0,1,2))						break;	\
		case BLENDFUNC_ONE_MINUS_DST_COLOR:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f) - dst.swizzle(0,1,2))			break;	\
		case BLENDFUNC_SRC_ALPHA:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(src.w()))							break;	\
		case BLENDFUNC_ONE_MINUS_SRC_ALPHA:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f - src.w()))						break;	\
		case BLENDFUNC_DST_ALPHA:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(dst.w()))							break;	\
		case BLENDFUNC_ONE_MINUS_DST_ALPHA:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f - dst.w()))						break;	\
		case BLENDFUNC_CONSTANT_COLOR:				SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, blendColor.swizzle(0,1,2))				break;	\
		case BLENDFUNC_ONE_MINUS_CONSTANT_COLOR:	SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f) - blendColor.swizzle(0,1,2))	break;	\
		case BLENDFUNC_CONSTANT_ALPHA:				SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(blendColor.w()))						break;	\
		case BLENDFUNC_ONE_MINUS_CONSTANT_ALPHA:	SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f - blendColor.w()))				break;	\
		case BLENDFUNC_SRC_ALPHA_SATURATE:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(de::min(src.w(), 1.0f - dst.w())))	break;	\
		case BLENDFUNC_SRC1_COLOR:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, src1.swizzle(0,1,2))						break;	\
		case BLENDFUNC_ONE_MINUS_SRC1_COLOR:		SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f) - src1.swizzle(0,1,2))			break;	\
		case BLENDFUNC_SRC1_ALPHA:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(src1.w()))							break;	\
		case BLENDFUNC_ONE_MINUS_SRC1_ALPHA:		SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f - src1.w()))					break;	\
		default:																																\
			DE_ASSERT(false);																													\
	}

	SWITCH_SRC_OR_DST_FACTOR_RGB(srcFunc, blendSrcFactorRGB)
	SWITCH_SRC_OR_DST_FACTOR_RGB(dstFunc, blendDstFactorRGB)

#undef SWITCH_SRC_OR_DST_FACTOR_RGB
#undef SAMPLE_REGISTER_BLEND_FACTOR
}